

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDsd.c
# Opt level: O1

int Lpk_DsdAnalizeOne(Lpk_Fun_t *p,uint *(*ppTruths) [16],Kit_DsdNtk_t **pNtks,char *pCofVars,
                     int nCofDepth,Lpk_Res_t *pRes)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uNonDecSupp;
  int iVar4;
  Kit_DsdNtk_t *p_00;
  Vec_Int_t *pVVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  Vec_Int_t **ppVVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  Vec_Int_t **ppVVar13;
  Vec_Int_t *pvBSets [4] [8];
  Vec_Int_t *local_138 [33];
  
  uVar11 = nCofDepth - 1;
  if (2 < uVar11) {
    __assert_fail("nCofDepth >= 1 && nCofDepth <= 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkAbcDsd.c"
                  ,0x17a,
                  "int Lpk_DsdAnalizeOne(Lpk_Fun_t *, unsigned int *(*)[16], Kit_DsdNtk_t **, char *, int, Lpk_Res_t *)"
                 );
  }
  if ((int)((*(uint *)&p->field_0x8 >> 0xc & 0xf) - 1) <= nCofDepth) {
    __assert_fail("nCofDepth < (int)p->nLutK - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkAbcDsd.c"
                  ,0x17b,
                  "int Lpk_DsdAnalizeOne(Lpk_Fun_t *, unsigned int *(*)[16], Kit_DsdNtk_t **, char *, int, Lpk_Res_t *)"
                 );
  }
  if ((*(uint *)&p->field_0x8 >> 0x1e & 1) == 0) {
    __assert_fail("p->fSupports",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkAbcDsd.c"
                  ,0x17c,
                  "int Lpk_DsdAnalizeOne(Lpk_Fun_t *, unsigned int *(*)[16], Kit_DsdNtk_t **, char *, int, Lpk_Res_t *)"
                 );
  }
  uVar2 = 1 << ((byte)uVar11 & 0x1f);
  uNonDecSupp = p->uSupp;
  uVar8 = 0;
  iVar4 = 0;
  do {
    iVar3 = Kit_DsdNonDsdSizeMax(pNtks[uVar8]);
    if (iVar4 < iVar3) {
      uNonDecSupp = Kit_DsdNonDsdSupports(pNtks[uVar8]);
      iVar4 = iVar3;
    }
    else if (iVar4 == iVar3) {
      uVar12 = Kit_DsdNonDsdSupports(pNtks[uVar8]);
      uNonDecSupp = uNonDecSupp | uVar12;
    }
    uVar8 = uVar8 + 1;
  } while (uVar2 != uVar8);
  lVar6 = 0;
  uVar12 = 0;
  do {
    uVar10 = 1 << ((byte)lVar6 & 0x1f);
    if ((p->uSupp >> ((uint)lVar6 & 0x1f) & 1) != 0) {
      if (p->pDelays[lVar6] <= (int)(p->nDelayLim - 2)) {
        uVar10 = 0;
      }
      uVar12 = uVar12 | uVar10;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x10);
  if ((~uVar12 & uNonDecSupp) == 0) {
    pRes->nSuppSizeS = 0;
    pRes->nSuppSizeL = 0;
    pRes->DelayEst = 0;
    pRes->AreaEst = 0;
    pRes->nBSVars = 0;
    pRes->BSVars = 0;
    pRes->nCofVars = 0;
    pRes->pCofVars[0] = '\0';
    pRes->pCofVars[1] = '\0';
    pRes->pCofVars[2] = '\0';
    pRes->pCofVars[3] = '\0';
    pRes->Variable = 0;
    pRes->Polarity = 0;
    iVar4 = 0;
  }
  else {
    uVar7 = (ulong)uVar11;
    uVar8 = (ulong)(uint)nCofDepth;
    iVar4 = Lpk_FunComputeMinSuppSizeVar
                      (p,ppTruths[uVar7],uVar2,ppTruths[uVar8],~uVar12 & uNonDecSupp);
    pCofVars[uVar7] = (char)iVar4;
    ppVVar9 = local_138 + uVar8 * 8;
    lVar6 = 0;
    do {
      if (pNtks[lVar6] != (Kit_DsdNtk_t *)0x0) {
        Kit_DsdNtkFree(pNtks[lVar6]);
      }
      p_00 = Kit_DsdDecomposeExpand(ppTruths[uVar8][lVar6],*(uint *)&p->field_0x8 >> 7 & 0x1f);
      pNtks[lVar6] = p_00;
      pVVar5 = Lpk_ComputeBoundSets(p_00,(*(uint *)&p->field_0x8 >> 0xc & 0xf) - nCofDepth);
      ppVVar9[lVar6] = pVVar5;
      lVar6 = lVar6 + 1;
    } while ((uint)lVar6 >> ((byte)nCofDepth & 0x1f) == 0);
    ppVVar13 = local_138 + uVar7 * 8;
    do {
      lVar6 = 0x24;
      uVar11 = 1;
      do {
        pVVar5 = Lpk_MergeBoundSets(*(Vec_Int_t **)((long)ppVVar13 + lVar6 * 2 + -8),
                                    *(Vec_Int_t **)((long)ppVVar13 + lVar6 * 2),
                                    (*(uint *)&p->field_0x8 >> 0xc & 0xf) - nCofDepth);
        *(Vec_Int_t **)((long)ppVVar13 + lVar6 + -0x24) = pVVar5;
        lVar6 = lVar6 + 8;
        uVar2 = uVar11 >> ((byte)uVar7 & 0x1f);
        uVar11 = uVar11 + 1;
      } while (uVar2 == 0);
      ppVVar13 = ppVVar13 + -8;
      bVar1 = 0 < (long)uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar1);
    Lpk_FunCompareBoundSets(p,local_138[0],nCofDepth,uNonDecSupp,uVar12,pRes);
    uVar7 = uVar8;
    if (-1 < nCofDepth) {
      do {
        lVar6 = 0;
        do {
          pVVar5 = ppVVar9[lVar6];
          if (pVVar5->pArray != (int *)0x0) {
            free(pVVar5->pArray);
            pVVar5->pArray = (int *)0x0;
          }
          if (pVVar5 != (Vec_Int_t *)0x0) {
            free(pVVar5);
          }
          lVar6 = lVar6 + 1;
        } while ((uint)lVar6 >> ((byte)uVar7 & 0x1f) == 0);
        ppVVar9 = ppVVar9 + -8;
        bVar1 = 0 < (long)uVar7;
        uVar7 = uVar7 - 1;
      } while (bVar1);
    }
    iVar4 = 1;
    if ((pRes->BSVars != 0) && (pRes->nCofVars = nCofDepth, 0 < nCofDepth)) {
      uVar7 = 0;
      do {
        pRes->pCofVars[uVar7] = pCofVars[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar8 != uVar7);
    }
  }
  return iVar4;
}

Assistant:

int Lpk_DsdAnalizeOne( Lpk_Fun_t * p, unsigned * ppTruths[5][16], Kit_DsdNtk_t * pNtks[], char pCofVars[], int nCofDepth, Lpk_Res_t * pRes )
{
    int fVerbose = 0;
    Vec_Int_t * pvBSets[4][8];
    unsigned uNonDecSupp, uLateArrSupp;
    int i, k, nNonDecSize, nNonDecSizeMax;
    assert( nCofDepth >= 1 && nCofDepth <= 3 );
    assert( nCofDepth < (int)p->nLutK - 1 );
    assert( p->fSupports );

    // find the support of the largest non-DSD block
    nNonDecSizeMax = 0;
    uNonDecSupp = p->uSupp;
    for ( i = 0; i < (1<<(nCofDepth-1)); i++ )
    {
        nNonDecSize = Kit_DsdNonDsdSizeMax( pNtks[i] );
        if ( nNonDecSizeMax < nNonDecSize )
        {
            nNonDecSizeMax = nNonDecSize;
            uNonDecSupp = Kit_DsdNonDsdSupports( pNtks[i] );
        }
        else if ( nNonDecSizeMax == nNonDecSize )
            uNonDecSupp |= Kit_DsdNonDsdSupports( pNtks[i] );
    }

    // remove those variables that cannot be used because of delay constraints
    // if variables arrival time is more than p->DelayLim - 2, it cannot be used
    uLateArrSupp = Lpk_DsdLateArriving( p );
    if ( (uNonDecSupp & ~uLateArrSupp) == 0 )
    {
        memset( pRes, 0, sizeof(Lpk_Res_t) );
        return 0;
    }

    // find the next cofactoring variable
    pCofVars[nCofDepth-1] = Lpk_FunComputeMinSuppSizeVar( p, ppTruths[nCofDepth-1], 1<<(nCofDepth-1), ppTruths[nCofDepth], uNonDecSupp & ~uLateArrSupp );

    // derive decomposed networks
    for ( i = 0; i < (1<<nCofDepth); i++ )
    {
        if ( pNtks[i] )
            Kit_DsdNtkFree( pNtks[i] );
        pNtks[i] = Kit_DsdDecomposeExpand( ppTruths[nCofDepth][i], p->nVars );
if ( fVerbose )
Kit_DsdPrint( stdout, pNtks[i] );
        pvBSets[nCofDepth][i] = Lpk_ComputeBoundSets( pNtks[i], p->nLutK - nCofDepth ); // try restricting to those in uNonDecSupp!!!
    }

    // derive the set of feasible boundsets
    for ( i = nCofDepth - 1; i >= 0; i-- )
        for ( k = 0; k < (1<<i); k++ )
            pvBSets[i][k] = Lpk_MergeBoundSets( pvBSets[i+1][2*k+0], pvBSets[i+1][2*k+1], p->nLutK - nCofDepth );
    // compare bound-sets
    Lpk_FunCompareBoundSets( p, pvBSets[0][0], nCofDepth, uNonDecSupp, uLateArrSupp, pRes );
    // free the bound sets
    for ( i = nCofDepth; i >= 0; i-- )
        for ( k = 0; k < (1<<i); k++ )
            Vec_IntFree( pvBSets[i][k] );
 
    // copy the cofactoring variables
    if ( pRes->BSVars )
    {
        pRes->nCofVars = nCofDepth;
        for ( i = 0; i < nCofDepth; i++ )
            pRes->pCofVars[i] = pCofVars[i];
    }
    return 1;
}